

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O0

bool BlockStream_Read(TBlockStream *pStream,ULONGLONG *pByteOffset,void *pvBuffer,
                     DWORD dwBytesToRead)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  LPBYTE __ptr;
  ulong local_80;
  bool local_74;
  bool local_71;
  bool bResult;
  bool bBlockAvailable;
  bool bCallbackCalled;
  bool bPrevBlockAvailable;
  DWORD BlockCount;
  DWORD BlockSize;
  DWORD BytesNeeded;
  DWORD BlockBufferOffset;
  LPBYTE BlockBuffer;
  LPBYTE TransferBuffer;
  ULONGLONG EndOffset;
  ULONGLONG ByteOffset;
  ULONGLONG BlockOffset;
  ULONGLONG BlockOffset0;
  DWORD dwBytesToRead_local;
  void *pvBuffer_local;
  ULONGLONG *pByteOffset_local;
  TBlockStream *pStream_local;
  
  uVar1 = pStream->BlockSize;
  bVar2 = false;
  local_74 = true;
  if ((pStream->super_TFileStream).BlockRead == (BLOCK_READ)0x0) {
    __assert_fail("pStream->BlockRead != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                  ,0x34f,"bool BlockStream_Read(TBlockStream *, ULONGLONG *, void *, DWORD)");
  }
  if (dwBytesToRead == 0) {
    pStream_local._7_1_ = true;
  }
  else {
    if (pByteOffset == (ULONGLONG *)0x0) {
      local_80 = (pStream->super_TFileStream).StreamPos;
    }
    else {
      local_80 = *pByteOffset;
    }
    TransferBuffer = (LPBYTE)(local_80 + dwBytesToRead);
    if ((LPBYTE)(pStream->super_TFileStream).StreamSize < TransferBuffer) {
      SetLastError(0x3ea);
      pStream_local._7_1_ = false;
    }
    else {
      ByteOffset = local_80 & ((ulong)uVar1 - 1 ^ 0xffffffffffffffff);
      BlockCount = (int)TransferBuffer - (int)ByteOffset;
      if ((uVar1 & uVar1 - 1) != 0) {
        __assert_fail("(BlockSize & (BlockSize - 1)) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                      ,0x364,"bool BlockStream_Read(TBlockStream *, ULONGLONG *, void *, DWORD)");
      }
      __ptr = (LPBYTE)malloc((ulong)((int)((ulong)(TransferBuffer + ((uVar1 - 1) - ByteOffset)) /
                                          (ulong)uVar1) * uVar1));
      if (__ptr == (LPBYTE)0x0) {
        SetLastError(0xc);
        pStream_local._7_1_ = false;
      }
      else {
        if (pStream->IsComplete == 0) {
          if ((pStream->super_TFileStream).BlockCheck == (BLOCK_CHECK)0x0) {
            __assert_fail("pStream->BlockCheck != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                          ,0x374,"bool BlockStream_Read(TBlockStream *, ULONGLONG *, void *, DWORD)"
                         );
          }
          local_71 = (*(pStream->super_TFileStream).BlockCheck)
                               (&pStream->super_TFileStream,ByteOffset);
          _BytesNeeded = __ptr;
          BlockOffset = ByteOffset;
          for (; iVar3 = (int)ByteOffset, iVar4 = (int)BlockOffset, ByteOffset < TransferBuffer;
              ByteOffset = uVar1 + ByteOffset) {
            bVar5 = (*(pStream->super_TFileStream).BlockCheck)
                              (&pStream->super_TFileStream,ByteOffset);
            if (bVar5 != local_71) {
              if ((((pStream->super_TFileStream).pMaster != (TFileStream *)0x0) &&
                  (pStream->pfnCallback != (STREAM_DOWNLOAD_CALLBACK)0x0)) && (local_71 == false)) {
                (*pStream->pfnCallback)(pStream->UserData,BlockOffset,iVar3 - iVar4);
                bVar2 = true;
              }
              if (ByteOffset <= BlockOffset) {
                __assert_fail("BlockOffset > BlockOffset0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                              ,0x388,
                              "bool BlockStream_Read(TBlockStream *, ULONGLONG *, void *, DWORD)");
              }
              local_74 = (*(pStream->super_TFileStream).BlockRead)
                                   (&pStream->super_TFileStream,BlockOffset,ByteOffset,_BytesNeeded,
                                    BlockCount,local_71);
              if (!local_74) break;
              _BytesNeeded = _BytesNeeded + (uint)(iVar3 - iVar4);
              BlockCount = BlockCount - (iVar3 - iVar4);
              BlockOffset = ByteOffset;
              local_71 = bVar5;
            }
          }
          if (BlockOffset < ByteOffset) {
            if ((((pStream->super_TFileStream).pMaster != (TFileStream *)0x0) &&
                (pStream->pfnCallback != (STREAM_DOWNLOAD_CALLBACK)0x0)) && (local_71 == false)) {
              (*pStream->pfnCallback)(pStream->UserData,BlockOffset,iVar3 - iVar4);
              bVar2 = true;
            }
            if ((pStream->super_TFileStream).StreamSize < ByteOffset) {
              ByteOffset = (pStream->super_TFileStream).StreamSize;
            }
            local_74 = (*(pStream->super_TFileStream).BlockRead)
                                 (&pStream->super_TFileStream,BlockOffset,ByteOffset,_BytesNeeded,
                                  BlockCount,local_71);
          }
        }
        else {
          if ((LPBYTE)(pStream->super_TFileStream).StreamSize < TransferBuffer) {
            TransferBuffer = (LPBYTE)(pStream->super_TFileStream).StreamSize;
          }
          local_74 = (*(pStream->super_TFileStream).BlockRead)
                               (&pStream->super_TFileStream,ByteOffset,(ULONGLONG)TransferBuffer,
                                __ptr,BlockCount,true);
        }
        if (local_74 == false) {
          SetLastError(0x3ee);
        }
        else {
          memcpy(pvBuffer,__ptr + ((uint)local_80 & uVar1 - 1),(ulong)dwBytesToRead);
          (pStream->super_TFileStream).StreamPos = local_80 + dwBytesToRead;
        }
        if (bVar2) {
          (*pStream->pfnCallback)(pStream->UserData,0,0);
        }
        free(__ptr);
        pStream_local._7_1_ = local_74;
      }
    }
  }
  return pStream_local._7_1_;
}

Assistant:

static bool BlockStream_Read(
    TBlockStream * pStream,                 // Pointer to an open stream
    ULONGLONG * pByteOffset,                // Pointer to file byte offset. If NULL, it reads from the current position
    void * pvBuffer,                        // Pointer to data to be read
    DWORD dwBytesToRead)                    // Number of bytes to read from the file
{
    ULONGLONG BlockOffset0;
    ULONGLONG BlockOffset;
    ULONGLONG ByteOffset;
    ULONGLONG EndOffset;
    LPBYTE TransferBuffer;
    LPBYTE BlockBuffer;
    DWORD BlockBufferOffset;                // Offset of the desired data in the block buffer
    DWORD BytesNeeded;                      // Number of bytes that really need to be read
    DWORD BlockSize = pStream->BlockSize;
    DWORD BlockCount;
    bool bPrevBlockAvailable;
    bool bCallbackCalled = false;
    bool bBlockAvailable;
    bool bResult = true;

    // The base block read function must be present
    assert(pStream->BlockRead != NULL);

    // NOP reading of zero bytes
    if(dwBytesToRead == 0)
        return true;

    // Get the current position in the stream
    ByteOffset = (pByteOffset != NULL) ? pByteOffset[0] : pStream->StreamPos;
    EndOffset = ByteOffset + dwBytesToRead;
    if(EndOffset > pStream->StreamSize)
    {
        SetLastError(ERROR_HANDLE_EOF);
        return false;
    }

    // Calculate the block parameters
    BlockOffset0 = BlockOffset = ByteOffset & ~((ULONGLONG)BlockSize - 1);
    BlockCount  = (DWORD)(((EndOffset - BlockOffset) + (BlockSize - 1)) / BlockSize);
    BytesNeeded = (DWORD)(EndOffset - BlockOffset);

    // Remember where we have our data
    assert((BlockSize & (BlockSize - 1)) == 0);
    BlockBufferOffset = (DWORD)(ByteOffset & (BlockSize - 1));

    // Allocate buffer for reading blocks
    TransferBuffer = BlockBuffer = CASC_ALLOC(BYTE, (BlockCount * BlockSize));
    if(TransferBuffer == NULL)
    {
        SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        return false;
    }

    // If all blocks are available, just read all blocks at once
    if(pStream->IsComplete == 0)
    {
        // Now parse the blocks and send the block read request
        // to all blocks with the same availability
        assert(pStream->BlockCheck != NULL);
        bPrevBlockAvailable = pStream->BlockCheck(pStream, BlockOffset);

        // Loop as long as we have something to read
        while(BlockOffset < EndOffset)
        {
            // Determine availability of the next block
            bBlockAvailable = pStream->BlockCheck(pStream, BlockOffset);

            // If the availability has changed, read all blocks up to this one
            if(bBlockAvailable != bPrevBlockAvailable)
            {
                // Call the file stream callback, if the block is not available
                if(pStream->pMaster && pStream->pfnCallback && bPrevBlockAvailable == false)
                {
                    pStream->pfnCallback(pStream->UserData, BlockOffset0, (DWORD)(BlockOffset - BlockOffset0));
                    bCallbackCalled = true;
                }

                // Load the continuous blocks with the same availability
                assert(BlockOffset > BlockOffset0);
                bResult = pStream->BlockRead(pStream, BlockOffset0, BlockOffset, BlockBuffer, BytesNeeded, bPrevBlockAvailable);
                if(!bResult)
                    break;

                // Move the block offset
                BlockBuffer += (DWORD)(BlockOffset - BlockOffset0);
                BytesNeeded -= (DWORD)(BlockOffset - BlockOffset0);
                bPrevBlockAvailable = bBlockAvailable;
                BlockOffset0 = BlockOffset;
            }

            // Move to the block offset in the stream
            BlockOffset += BlockSize;
        }

        // If there is a block(s) remaining to be read, do it
        if(BlockOffset > BlockOffset0)
        {
            // Call the file stream callback, if the block is not available
            if(pStream->pMaster && pStream->pfnCallback && bPrevBlockAvailable == false)
            {
                pStream->pfnCallback(pStream->UserData, BlockOffset0, (DWORD)(BlockOffset - BlockOffset0));
                bCallbackCalled = true;
            }

            // Read the complete blocks from the file
            if(BlockOffset > pStream->StreamSize)
                BlockOffset = pStream->StreamSize;
            bResult = pStream->BlockRead(pStream, BlockOffset0, BlockOffset, BlockBuffer, BytesNeeded, bPrevBlockAvailable);
        }
    }
    else
    {
        // Read the complete blocks from the file
        if(EndOffset > pStream->StreamSize)
            EndOffset = pStream->StreamSize;
        bResult = pStream->BlockRead(pStream, BlockOffset, EndOffset, BlockBuffer, BytesNeeded, true);
    }

    // Now copy the data to the user buffer
    if(bResult)
    {
        memcpy(pvBuffer, TransferBuffer + BlockBufferOffset, dwBytesToRead);
        pStream->StreamPos = ByteOffset + dwBytesToRead;
    }
    else
    {
        // If the block read failed, set the last error
        SetLastError(ERROR_FILE_INCOMPLETE);
    }

    // Call the callback to indicate we are done
    if(bCallbackCalled)
        pStream->pfnCallback(pStream->UserData, 0, 0);

    // Free the block buffer and return
    CASC_FREE(TransferBuffer);
    return bResult;
}